

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-handle-fileno.c
# Opt level: O3

int run_test_handle_fileno(void)

{
  int iVar1;
  int extraout_EAX;
  uv_loop_t *loop;
  uv_loop_t *puVar2;
  uv_os_fd_t fd;
  sockaddr_in addr;
  uv_idle_t idle;
  uv_udp_t udp;
  uv_tty_t tty;
  uv_tcp_t tcp;
  uv_pipe_t pipe;
  uv_os_fd_t local_4ac;
  sockaddr_in local_4a8;
  undefined1 local_498 [120];
  undefined1 local_420 [216];
  undefined1 local_348 [312];
  undefined1 local_210 [248];
  
  loop = uv_default_loop();
  puVar2 = (uv_loop_t *)0x1a4b3a;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&local_4a8);
  if (iVar1 == 0) {
    puVar2 = loop;
    iVar1 = uv_idle_init(loop,(uv_idle_t *)local_498);
    if (iVar1 != 0) goto LAB_0015a369;
    puVar2 = (uv_loop_t *)local_498;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -0x16) goto LAB_0015a36e;
    uv_close((uv_handle_t *)local_498,(uv_close_cb)0x0);
    puVar2 = loop;
    iVar1 = uv_tcp_init(loop,(uv_tcp_t *)local_210);
    if (iVar1 != 0) goto LAB_0015a373;
    puVar2 = (uv_loop_t *)local_210;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -9) goto LAB_0015a378;
    puVar2 = (uv_loop_t *)local_210;
    iVar1 = uv_tcp_bind((uv_tcp_t *)puVar2,(sockaddr *)&local_4a8,0);
    if (iVar1 != 0) goto LAB_0015a37d;
    puVar2 = (uv_loop_t *)local_210;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != 0) goto LAB_0015a382;
    puVar2 = (uv_loop_t *)local_210;
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -9) goto LAB_0015a387;
    puVar2 = loop;
    iVar1 = uv_udp_init(loop,(uv_udp_t *)local_420);
    if (iVar1 != 0) goto LAB_0015a38c;
    puVar2 = (uv_loop_t *)local_420;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -9) goto LAB_0015a391;
    puVar2 = (uv_loop_t *)local_420;
    iVar1 = uv_udp_bind((uv_udp_t *)puVar2,(sockaddr *)&local_4a8,0);
    if (iVar1 != 0) goto LAB_0015a396;
    puVar2 = (uv_loop_t *)local_420;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != 0) goto LAB_0015a39b;
    puVar2 = (uv_loop_t *)local_420;
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -9) goto LAB_0015a3a0;
    puVar2 = loop;
    iVar1 = uv_pipe_init(loop,(uv_pipe_t *)&stack0xfffffffffffffee8,0);
    if (iVar1 != 0) goto LAB_0015a3a5;
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffee8;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -9) goto LAB_0015a3aa;
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffee8;
    iVar1 = uv_pipe_bind((uv_pipe_t *)puVar2,"/tmp/uv-test-sock");
    if (iVar1 != 0) goto LAB_0015a3af;
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffee8;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != 0) goto LAB_0015a3b4;
    puVar2 = (uv_loop_t *)&stack0xfffffffffffffee8;
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -9) goto LAB_0015a3b9;
    iVar1 = open64("/dev/tty",0,0);
    if (iVar1 < 0) {
      run_test_handle_fileno_cold_26();
LAB_0015a312:
      uv_run(loop,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      uv_walk(puVar2,close_walk_cb,(void *)0x0);
      uv_run(puVar2,UV_RUN_DEFAULT);
      puVar2 = uv_default_loop();
      iVar1 = uv_loop_close(puVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015a3be;
    }
    puVar2 = loop;
    iVar1 = uv_tty_init(loop,(uv_tty_t *)local_348,iVar1,0);
    if (iVar1 != 0) goto LAB_0015a3c3;
    puVar2 = (uv_loop_t *)local_348;
    iVar1 = uv_is_readable((uv_stream_t *)puVar2);
    if (iVar1 == 0) goto LAB_0015a3c8;
    puVar2 = (uv_loop_t *)local_348;
    iVar1 = uv_is_writable((uv_stream_t *)puVar2);
    if (iVar1 != 0) goto LAB_0015a3cd;
    puVar2 = (uv_loop_t *)local_348;
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != 0) goto LAB_0015a3d2;
    puVar2 = (uv_loop_t *)local_348;
    uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
    iVar1 = uv_fileno((uv_handle_t *)puVar2,&local_4ac);
    if (iVar1 != -9) goto LAB_0015a3d7;
    puVar2 = (uv_loop_t *)local_348;
    iVar1 = uv_is_readable((uv_stream_t *)puVar2);
    if (iVar1 == 0) {
      puVar2 = (uv_loop_t *)local_348;
      iVar1 = uv_is_writable((uv_stream_t *)puVar2);
      if (iVar1 != 0) goto LAB_0015a3e1;
      goto LAB_0015a312;
    }
  }
  else {
    run_test_handle_fileno_cold_1();
LAB_0015a369:
    run_test_handle_fileno_cold_2();
LAB_0015a36e:
    run_test_handle_fileno_cold_3();
LAB_0015a373:
    run_test_handle_fileno_cold_4();
LAB_0015a378:
    run_test_handle_fileno_cold_5();
LAB_0015a37d:
    run_test_handle_fileno_cold_6();
LAB_0015a382:
    run_test_handle_fileno_cold_7();
LAB_0015a387:
    run_test_handle_fileno_cold_8();
LAB_0015a38c:
    run_test_handle_fileno_cold_9();
LAB_0015a391:
    run_test_handle_fileno_cold_10();
LAB_0015a396:
    run_test_handle_fileno_cold_11();
LAB_0015a39b:
    run_test_handle_fileno_cold_12();
LAB_0015a3a0:
    run_test_handle_fileno_cold_13();
LAB_0015a3a5:
    run_test_handle_fileno_cold_14();
LAB_0015a3aa:
    run_test_handle_fileno_cold_15();
LAB_0015a3af:
    run_test_handle_fileno_cold_16();
LAB_0015a3b4:
    run_test_handle_fileno_cold_17();
LAB_0015a3b9:
    run_test_handle_fileno_cold_18();
LAB_0015a3be:
    run_test_handle_fileno_cold_27();
LAB_0015a3c3:
    run_test_handle_fileno_cold_19();
LAB_0015a3c8:
    run_test_handle_fileno_cold_25();
LAB_0015a3cd:
    run_test_handle_fileno_cold_20();
LAB_0015a3d2:
    run_test_handle_fileno_cold_21();
LAB_0015a3d7:
    run_test_handle_fileno_cold_22();
  }
  run_test_handle_fileno_cold_23();
LAB_0015a3e1:
  run_test_handle_fileno_cold_24();
  iVar1 = uv_is_closing((uv_handle_t *)puVar2);
  if (iVar1 != 0) {
    return iVar1;
  }
  uv_close((uv_handle_t *)puVar2,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(handle_fileno) {
  int r;
  int tty_fd;
  struct sockaddr_in addr;
  uv_os_fd_t fd;
  uv_tcp_t tcp;
  uv_udp_t udp;
  uv_pipe_t pipe;
  uv_tty_t tty;
  uv_idle_t idle;
  uv_loop_t* loop;

  loop = uv_default_loop();
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  r = uv_idle_init(loop, &idle);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &idle, &fd);
  ASSERT(r == UV_EINVAL);
  uv_close((uv_handle_t*) &idle, NULL);

  r = uv_tcp_init(loop, &tcp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_tcp_bind(&tcp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &tcp, NULL);
  r = uv_fileno((uv_handle_t*) &tcp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_udp_init(loop, &udp);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_udp_bind(&udp, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &udp, NULL);
  r = uv_fileno((uv_handle_t*) &udp, &fd);
  ASSERT(r == UV_EBADF);

  r = uv_pipe_init(loop, &pipe, 0);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);
  r = uv_pipe_bind(&pipe, TEST_PIPENAME);
  ASSERT(r == 0);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == 0);
  uv_close((uv_handle_t*) &pipe, NULL);
  r = uv_fileno((uv_handle_t*) &pipe, &fd);
  ASSERT(r == UV_EBADF);

  tty_fd = get_tty_fd();
  if (tty_fd < 0) {
    fprintf(stderr, "Cannot open a TTY fd");
    fflush(stderr);
  } else {
    r = uv_tty_init(loop, &tty, tty_fd, 0);
    ASSERT(r == 0);
    ASSERT(uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == 0);
    uv_close((uv_handle_t*) &tty, NULL);
    r = uv_fileno((uv_handle_t*) &tty, &fd);
    ASSERT(r == UV_EBADF);
    ASSERT(!uv_is_readable((uv_stream_t*) &tty));
    ASSERT(!uv_is_writable((uv_stream_t*) &tty));
  }

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY();
  return 0;
}